

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O0

void __thiscall
InProcNativeEntryPointData::RecordInlineeFrameMap
          (InProcNativeEntryPointData *this,
          List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *tempInlineeFrameMap)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  JITManager *this_00;
  undefined4 *puVar4;
  HeapAllocator *alloc;
  List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  TrackAllocData local_40;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_18;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *tempInlineeFrameMap_local;
  InProcNativeEntryPointData *this_local;
  
  local_18 = tempInlineeFrameMap;
  tempInlineeFrameMap_local =
       (List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)this;
  this_00 = JITManager::GetJITManager();
  bVar2 = JITManager::IsOOPJITEnabled(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x1a7,"(!JITManager::GetJITManager()->IsOOPJITEnabled())",
                       "!JITManager::GetJITManager()->IsOOPJITEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->inlineeFrameMap != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x1a8,"(this->inlineeFrameMap == nullptr)",
                       "this->inlineeFrameMap == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = JsUtil::
          ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&local_18->
                      super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                    );
  if (0 < iVar3) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,
               (type_info *)
               &JsUtil::
                List<NativeOffsetInlineeFramePair,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
               ,0x1ab);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
    this_01 = (List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::HeapAllocator>(0x30,alloc,0x350bd0);
    JsUtil::
    List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::List(this_01,&Memory::HeapAllocator::Instance,4);
    this->inlineeFrameMap = this_01;
    JsUtil::
    List<NativeOffsetInlineeFramePair,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
    ::
    Copy<JsUtil::List<NativeOffsetInlineeFramePair,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
              ((List<NativeOffsetInlineeFramePair,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)this->inlineeFrameMap,local_18);
  }
  return;
}

Assistant:

void
InProcNativeEntryPointData::RecordInlineeFrameMap(JsUtil::List<NativeOffsetInlineeFramePair, ArenaAllocator>* tempInlineeFrameMap)
{
    Assert(!JITManager::GetJITManager()->IsOOPJITEnabled());
    Assert(this->inlineeFrameMap == nullptr);
    if (tempInlineeFrameMap->Count() > 0)
    {
        this->inlineeFrameMap = HeapNew(InlineeFrameMap, &HeapAllocator::Instance);
        this->inlineeFrameMap->Copy(tempInlineeFrameMap);
    }
}